

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O2

RCOError __thiscall RCO::getCharTableChar(RCO *this,u16string *c,uint32_t offset,uint32_t len)

{
  void *__s;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_50;
  
  __s = operator_new__((ulong)(len + 2) * 2);
  memset(__s,0,(ulong)(len + 2));
  memcpy(__s,this->mBuffer + (ulong)(offset * 2) + (ulong)(this->mHeader).char_start_off,(ulong)len)
  ;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::u16string::_M_construct<char16_t_const*>
            ((u16string *)&local_50,__s,(void *)((long)__s + (ulong)len * 2));
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  operator=(c,&local_50);
  std::__cxx11::u16string::~u16string((u16string *)&local_50);
  operator_delete__(__s);
  return NO_ERROR;
}

Assistant:

RCOError RCO::getCharTableChar(std::u16string &c, uint32_t offset, uint32_t len)
{
	char16_t *buf = new char16_t[len + 2];
	memset(buf, 0, len + 2);

	memcpy(buf, mBuffer + mHeader.char_start_off + (offset * 2), len);

	c = std::u16string(buf, len);

	delete[] buf;

	return NO_ERROR;
}